

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hh
# Opt level: O1

void __thiscall
MergeDecl::MergeDecl
          (MergeDecl *this,string *n,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *is)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + n->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->inputs,is);
  return;
}

Assistant:

MergeDecl(std::string n, std::vector<std::string> is)
        : name(n)
        , inputs(is)
    {
    }